

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_tensor_set(ggml_tensor *tensor,void *data,size_t offset,size_t size)

{
  int64_t *piVar1;
  size_t sVar2;
  long in_RCX;
  ggml_tensor *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ggml_backend_buffer_t buf;
  long local_30;
  
  if (in_RDI == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x101,"GGML_ASSERT(%s) failed","tensor");
  }
  if (*(long *)(in_RDI + 0xe8) == 0) {
    local_30 = *(long *)(in_RDI + 8);
  }
  else {
    local_30 = *(long *)(*(long *)(in_RDI + 0xe8) + 8);
  }
  if (in_RCX != 0) {
    if (local_30 == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x108,"GGML_ASSERT(%s) failed","buf != NULL && \"tensor buffer not set\"");
    }
    if (*(long *)(in_RDI + 0xf8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x109,"GGML_ASSERT(%s) failed","tensor->data != NULL && \"tensor not allocated\"")
      ;
    }
    piVar1 = in_RDX->ne;
    sVar2 = ggml_nbytes(in_RDX);
    if (sVar2 < (ulong)((long)piVar1 + in_RCX + -0x10)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x10a,"GGML_ASSERT(%s) failed",
                 "offset + size <= ggml_nbytes(tensor) && \"tensor write out of bounds\"");
    }
    (**(code **)(local_30 + 0x20))(local_30,in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void ggml_backend_tensor_set(struct ggml_tensor * tensor, const void * data, size_t offset, size_t size) {
    GGML_ASSERT(tensor);
    ggml_backend_buffer_t buf = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;

    if (size == 0) {
        return;
    }

    GGML_ASSERT(buf != NULL && "tensor buffer not set");
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor write out of bounds");

    buf->iface.set_tensor(buf, tensor, data, offset, size);
}